

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorbase.h
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::operator*(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *vec)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  x;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  
  StableSum<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::StableSum(&x);
  uVar1 = ((long)(this->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x38;
  uVar3 = 0;
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x38 - uVar3 != 0; uVar3 = uVar3 + 0x38) {
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 10;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems._24_5_ = 0;
    result.m_backend.data._M_elems[7]._1_3_ = 0;
    result.m_backend.data._M_elems._32_5_ = 0;
    result.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result.m_backend,
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&(((this->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + uVar3),
               (cpp_dec_float<50U,_int,_void> *)
               ((long)&(((vec->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + uVar3));
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
              ((cpp_dec_float<50U,_int,_void> *)&x,&result.m_backend);
  }
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
       x.sum.m_backend.data._M_elems._32_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
       x.sum.m_backend.data._M_elems._16_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
       x.sum.m_backend.data._M_elems._24_8_;
  *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
       x.sum.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
       x.sum.m_backend.data._M_elems._8_8_;
  (__return_storage_ptr__->m_backend).exp = x.sum.m_backend.exp;
  (__return_storage_ptr__->m_backend).neg = x.sum.m_backend.neg;
  (__return_storage_ptr__->m_backend).fpclass = x.sum.m_backend.fpclass;
  (__return_storage_ptr__->m_backend).prec_elem = x.sum.m_backend.prec_elem;
  return __return_storage_ptr__;
}

Assistant:

R operator*(const VectorBase<R>& vec) const
   {
      StableSum<R> x;

      auto dimen = dim();

      for(decltype(dimen) i = 0; i < dimen; i++)
         x += val[i] * vec.val[i];

      return x;
   }